

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O0

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  string local_70 [32];
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> local_30;
  string *local_18;
  string *s_local;
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  local_18 = s;
  s_local = (string *)this;
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
            );
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_00ab4d88;
  std::__cxx11::string::string(local_70,(string *)local_18);
  Eq<std::__cxx11::string>(&local_50,(testing *)local_70,x);
  Matcher<std::basic_string_view<char,std::char_traits<char>>const&>::
  Matcher<testing::internal::EqMatcher<std::__cxx11::string>,void>
            ((Matcher<std::basic_string_view<char,std::char_traits<char>>const&> *)&local_30,
             &local_50);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  internal::
  EqMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~EqMatcher(&local_50);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

Matcher<const internal::StringView&>::Matcher(const std::string& s) {
  *this = Eq(s);
}